

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::InlineApplyScriptTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *applyFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isArrayOpndArgumentsObject,uint argsCount)

{
  undefined1 *puVar1;
  code *pcVar2;
  Inline *pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  JITTimeFunctionBody *pJVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  Instr *pIVar13;
  StackSym *pSVar14;
  SymOpnd *pSVar15;
  undefined4 *puVar16;
  RegOpnd *pRVar17;
  Instr *pIVar18;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *newSrc;
  ByteCodeUsesInstr *this_01;
  anon_union_8_3_6c1fdb8e_for_scratch *paVar19;
  IntConstOpnd *pIVar20;
  Instr *pIVar21;
  char16_t *form;
  uint uVar22;
  Instr *pIVar23;
  Instr *pIVar24;
  byte bVar25;
  Instr *pIVar26;
  wchar local_168 [4];
  char16 debugStringBuffer2 [42];
  bool local_108 [8];
  char16 debugStringBuffer [42];
  Instr *applyLdInstr;
  Instr *applyTargetLdInstr;
  FunctionJITTimeInfo *inlineeData;
  Instr *callbackDefInstr;
  StackSym *local_88;
  Instr *local_80;
  anon_union_8_3_6c1fdb8e_for_scratch *local_78;
  InlineCacheIndex local_6c;
  Instr *pIStack_68;
  InlineCacheIndex inlineCacheIndex;
  Instr *local_60;
  Inline *local_58;
  Instr *local_50;
  undefined4 *local_48;
  Instr *local_40;
  CallApplyTargetSourceType local_32;
  byte local_31;
  CallApplyTargetSourceType targetType;
  
  if (this->isApplyTargetInliningInProgress == true) {
    uVar6 = Func::GetSourceContextId(this->topFunc);
    uVar7 = Func::GetLocalFunctionId(this->topFunc);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
    if (!bVar4) {
      return false;
    }
    pJVar8 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_108);
    pJVar8 = Func::GetJITFunctionBody(this->topFunc);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar12 = Func::GetDebugNumberSet(this->topFunc,(wchar (*) [42])local_168);
    form = 
    L"INLINING: Skip Inline: Skipping apply target inlining, Recursive apply inlining is not supported \tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"
    ;
LAB_00508446:
    Output::Print(form,pcVar9,pcVar10,pcVar11,pcVar12);
    Output::Flush();
    return false;
  }
  stack0xffffffffffffff50 = (Instr *)0x0;
  applyLdInstr = (Instr *)0x0;
  pIStack_68 = (Instr *)symCallerThis;
  bVar4 = TryGetCallApplyAndTargetLdInstrs
                    (this,callInstr,(Instr **)(debugStringBuffer + 0x28),&applyLdInstr);
  pIVar13 = applyLdInstr;
  if (!bVar4) {
    return false;
  }
  applyTargetLdInstr = (Instr *)0x0;
  local_6c = 0xffffffff;
  inlineeData = (FunctionJITTimeInfo *)0x0;
  local_32 = None;
  local_60 = stack0xffffffffffffff50;
  local_58 = this;
  local_40 = callInstr;
  bVar4 = TryGetCallApplyInlineeData
                    (this,inlinerData,callInstr,stack0xffffffffffffff50,applyLdInstr,
                     (FunctionJITTimeInfo **)&applyTargetLdInstr,&local_6c,(Instr **)&inlineeData,
                     false,&local_32);
  pIVar23 = applyTargetLdInstr;
  if (!bVar4) {
    return false;
  }
  if ((argsCount != 1 && !isArrayOpndArgumentsObject) ||
     (bVar4 = SkipCallApplyScriptTargetInlining_Shared
                        (local_58,local_40,inlinerData,(FunctionJITTimeInfo *)applyTargetLdInstr,
                         true,false), pIVar18 = local_40, pIVar3 = local_58, bVar4)) {
    *pInlineeData = (FunctionJITTimeInfo *)pIVar23;
    return false;
  }
  if (local_40->m_func->parentFunc == (Func *)0x0) {
    uVar6 = Func::GetSourceContextId(local_58->topFunc);
    uVar7 = Func::GetLocalFunctionId(pIVar3->topFunc);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar6,uVar7);
    if (!bVar4) {
      return false;
    }
    pJVar8 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_108);
    pJVar8 = Func::GetJITFunctionBody(pIVar3->topFunc);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar12 = Func::GetDebugNumberSet(pIVar3->topFunc,(wchar (*) [42])local_168);
    form = 
    L"INLINING: Skip Inline: Skipping apply target inlining in top func\tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"
    ;
    goto LAB_00508446;
  }
  callbackDefInstr = (Instr *)inlineeData;
  local_50 = (Instr *)(ulong)(inlineeData != (FunctionJITTimeInfo *)0x0);
  local_88 = IR::Opnd::GetStackSym(local_40->m_src1);
  local_31 = pIVar18->m_src1->field_0xb;
  local_108[0] = false;
  pIVar13 = TryGetFixedMethodsForBuiltInAndTarget
                      (local_58,pIVar18,inlinerData,(FunctionJITTimeInfo *)pIVar23,applyFuncInfo,
                       local_60,pIVar13,local_108,true,SUB81(local_50,0));
  bVar4 = pIVar13 != (Instr *)0x0;
  if (!bVar4) {
    return bVar4;
  }
  local_80 = pIVar23;
  pSVar14 = IR::Opnd::GetStackSym(local_40->m_src2);
  pIVar13 = (pSVar14->field_5).m_instrDef;
  if ((pIVar13 != (Instr *)0x0 & pSVar14->field_0x18) == 1) {
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) goto LAB_00508c87;
    *puVar16 = 0;
    pIVar13 = (pSVar14->field_5).m_instrDef;
    local_48 = puVar16;
  }
  local_50 = (Instr *)0x0;
  pIVar18 = (Instr *)0x0;
  pIVar23 = (Instr *)0x0;
  do {
    if ((pIVar13->m_src2 == (Opnd *)0x0) || (bVar5 = IR::Opnd::IsSymOpnd(pIVar13->m_src2), !bVar5))
    {
      pIVar21 = (Instr *)0x0;
      pIVar26 = pIVar18;
    }
    else {
      local_60 = pIVar18;
      pSVar15 = IR::Opnd::AsSymOpnd(pIVar13->m_src2);
      pSVar14 = Sym::AsStackSym(pSVar15->m_sym);
      bVar5 = StackSym::IsArgSlotSym(pSVar14);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_48;
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_00508c87;
        *puVar16 = 0;
      }
      if (((((pSVar14->field_0x18 & 1) == 0) || ((pSVar14->field_5).m_instrDef == (Instr *)0x0)) &&
          (bVar5 = Func::IsInPhase(local_40->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(local_40->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_48;
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_00508c87;
        *puVar16 = 0;
      }
      pIVar26 = local_60;
      if ((pSVar14->field_0x18 & 1) == 0) {
        pIVar21 = (Instr *)0x0;
      }
      else {
        pIVar21 = (pSVar14->field_5).m_instrDef;
      }
    }
    pIVar24 = pIVar23;
    pIVar18 = pIVar26;
    if (pIVar13->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar13->m_opcode == StartCall) {
        if (pIVar21 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = local_48;
          *local_48 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_00508c87;
          *puVar16 = 0;
        }
        break;
      }
      IR::Instr::GenerateBytecodeArgOutCapture(pIVar13);
      pSVar15 = IR::Opnd::AsSymOpnd(pIVar13->m_dst);
      pSVar14 = IR::Opnd::GetStackSym(&pSVar15->super_Opnd);
      StackSym::DecrementArgSlotNum(pSVar14);
      pIVar24 = pIVar13;
      pIVar18 = pIVar23;
      local_50 = pIVar26;
    }
    pIVar13 = pIVar21;
    pIVar23 = pIVar24;
    pIVar26 = pIVar18;
  } while (pIVar21 != (Instr *)0x0);
  bVar5 = HasArgumentsAccess(local_58,pIVar26);
  if (!bVar5) {
    puVar1 = &local_40->m_func->field_0x240;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
  }
  uVar22 = (uint)CONCAT71((int7)((ulong)pIVar13 >> 8),local_108[0]);
  if (local_108[0] == true) {
    pIVar13 = IR::Instr::GetBytecodeArgOutCapture(pIVar26);
    bVar5 = IR::Opnd::IsRegOpnd(pIVar13->m_src1);
    if (!bVar5) {
      local_48 = (undefined4 *)CONCAT44(local_48._4_4_,uVar22);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xbf2,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                         "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
      if (!bVar5) goto LAB_00508c87;
      *puVar16 = 0;
      uVar22 = (uint)local_48;
    }
    pRVar17 = IR::Opnd::AsRegOpnd(pIVar13->m_src1);
    pIVar13 = (Instr *)IR::Opnd::GetStackSym(&pRVar17->super_Opnd);
    uVar22 = uVar22 & 0xff;
    if (pIVar13 != pIStack_68) {
      uVar22 = 0;
    }
  }
  bVar5 = IR::Opnd::IsRegOpnd(pIVar23->m_src2);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xbfa,"(implicitThisArgOut->GetSrc2()->IsRegOpnd())",
                       "implicitThisArgOut->GetSrc2()->IsRegOpnd()");
    if (!bVar5) goto LAB_00508c87;
    *puVar16 = 0;
  }
  local_48 = (undefined4 *)CONCAT44(local_48._4_4_,uVar22);
  pIStack_68 = pIVar23;
  pRVar17 = IR::Opnd::AsRegOpnd(pIVar23->m_src2);
  pSVar14 = Sym::AsStackSym(&pRVar17->m_sym->super_Sym);
  pIVar13 = local_50;
  if ((pSVar14->field_0x18 & 1) == 0) {
    local_50 = (Instr *)0x0;
  }
  else {
    local_50 = (pSVar14->field_5).m_instrDef;
  }
  if (local_50->m_opcode != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xbfc,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_00508c87;
    *puVar16 = 0;
  }
  pIVar23 = local_40;
  local_60 = pIVar26;
  if (pIVar13 == (Instr *)0x0) {
    pIVar18 = IR::Instr::New(BytecodeArgOutUse,local_40->m_func);
    paVar19 = (anon_union_8_3_6c1fdb8e_for_scratch *)&pIStack_68->m_src1;
    pIVar13 = pIStack_68;
  }
  else {
    if (argsCount != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xc00,"(argsCount == 2)","argsCount == 2");
      if (!bVar5) {
LAB_00508c87:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar16 = 0;
    }
    pIVar18 = IR::Instr::GetBytecodeArgOutCapture(pIVar13);
    pSVar14 = IR::Opnd::GetStackSym(pIVar18->m_dst);
    pIVar23 = local_40;
    pSVar14->field_0x1b = pSVar14->field_0x1b | 4;
    pIVar13->m_opcode = ArgOut_A_FromStackArgs;
    this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailOnNotStackArgs,BailOutOnInlineFunction,local_40,local_40->m_func);
    local_78 = (anon_union_8_3_6c1fdb8e_for_scratch *)&pIVar13->m_src1;
    newSrc = IR::Opnd::Copy(pIVar13->m_src1,local_58->topFunc);
    IR::Instr::SetSrc1(&this_00->super_Instr,newSrc);
    IR::Instr::InsertBefore(pIVar13,&this_00->super_Instr);
    this_01 = IR::ByteCodeUsesInstr::New(pIVar23);
    bVar25 = pIVar18->m_src1->field_0xb;
    pSVar14 = IR::Opnd::GetStackSym(pIVar18->m_src1);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_01,(bool)((bVar25 & 8) >> 3),(pSVar14->super_Sym).m_id);
    IR::Instr::InsertBefore(pIVar23,&this_01->super_Instr);
    pIVar18 = IR::Instr::New(BytecodeArgOutUse,pIVar23->m_func);
    pIVar13 = pIStack_68;
    IR::Instr::SetSrc1(pIVar18,(Opnd *)*(anon_union_8_3_6c1fdb8e_for_scratch *)&pIStack_68->m_src1);
    IR::Instr::InsertBefore(pIVar23,pIVar18);
    pIVar18 = IR::Instr::New(BytecodeArgOutUse,pIVar23->m_func);
    paVar19 = local_78;
  }
  bVar25 = local_31 & 8;
  IR::Instr::SetSrc1(pIVar18,(Opnd *)*paVar19);
  IR::Instr::InsertBefore(pIVar23,pIVar18);
  pIVar18 = local_50;
  IR::Instr::ReplaceSrc2(local_60,local_50->m_dst);
  IR::Instr::Remove(pIVar13);
  uVar6 = IR::Instr::GetArgOutCount(pIVar18,false);
  pIVar20 = IR::IntConstOpnd::New((ulong)uVar6,TyUint32,pIVar18->m_func,false);
  IR::Instr::SetSrc2(pIVar18,&pIVar20->super_Opnd);
  pIVar20 = IR::Opnd::AsIntConstOpnd(pIVar18->m_src1);
  IR::IntConstOpnd::IncrValue(pIVar20,-1);
  pIVar13 = InlineCallApplyTarget_Shared
                      (local_58,pIVar23,(bool)(bVar25 >> 3),local_88,(FunctionJITTimeInfo *)local_80
                       ,local_6c,SUB81(local_48,0),true,local_32,callbackDefInstr,
                       recursiveInlineDepth,pIVar23);
  *returnInstr = pIVar13;
  return bVar4;
}

Assistant:

bool Inline::InlineApplyScriptTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *applyFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isArrayOpndArgumentsObject, uint argsCount)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (this->isApplyTargetInliningInProgress)
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Skipping apply target inlining, Recursive apply inlining is not supported \tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"), inlinerData->GetBody()->GetDisplayName(),
                                inlinerData->GetDebugNumberSet(debugStringBuffer), this->topFunc->GetJITFunctionBody()->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    // Begin inlining apply target

    IR::Instr* applyLdInstr = nullptr;
    IR::Instr* applyTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &applyLdInstr, &applyTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, applyLdInstr, applyTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, false, &targetType))
    {
        return false;
    }

    if ((!isArrayOpndArgumentsObject && (argsCount != 1)) || SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ true, /*isCallTarget*/ false))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    if (callInstr->m_func->IsTopFunc())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Skipping apply target inlining in top func\tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"), inlinerData->GetBody()->GetDisplayName(),
            inlinerData->GetDebugNumberSet(debugStringBuffer), this->topFunc->GetJITFunctionBody()->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    if (!TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, applyFuncInfo, applyLdInstr, applyTargetLdInstr, safeThis, /*isApplyTarget*/ true, targetIsCallback))
    {
        return false;
    }

    // o.foo.apply(obj[, arguments])
    //
    // StartCall
    // ArgOut_A         <-- implicit "this" (foo) argout
    // ArgOut_A         <-- explicit "this" (obj) argout
    // ArgOut_A         <-- arguments object argout
    // CallIFixed

    IR::Instr* implicitThisArgOut = nullptr;
    IR::Instr* explicitThisArgOut = nullptr;
    IR::Instr* argumentsObjArgOut = nullptr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        argumentsObjArgOut = explicitThisArgOut;
        explicitThisArgOut = implicitThisArgOut;
        implicitThisArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" (to be removed) and arguments object (to be expanded) argouts,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.
        argInstr->GetDst()->AsSymOpnd()->GetStackSym()->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        return false;
    });

    // If the arguments object was passed in as the first argument to apply,
    // 'arguments' access continues to exist even after apply target inlining
    if (!HasArgumentsAccess(explicitThisArgOut))
    {
        callInstr->m_func->SetApplyTargetInliningRemovedArgumentsAccess();
    }

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    Assert(implicitThisArgOut->GetSrc2()->IsRegOpnd());
    IR::Instr * startCall = implicitThisArgOut->GetSrc2()->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
    Assert(startCall->m_opcode == Js::OpCode::StartCall);

    if (argumentsObjArgOut)
    {
        Assert(argsCount == 2);
        IR::Instr* argObjByteCodeArgoutCapture = argumentsObjArgOut->GetBytecodeArgOutCapture();
        argObjByteCodeArgoutCapture->GetDst()->GetStackSym()->m_nonEscapingArgObjAlias = true;

        argumentsObjArgOut->m_opcode = Js::OpCode::ArgOut_A_FromStackArgs;

        IR::Instr *  bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction,
            callInstr, callInstr->m_func);
        // set src1 to avoid CSE on BailOnNotStackArgs for different arguments object
        bailOutOnNotStackArgs->SetSrc1(argumentsObjArgOut->GetSrc1()->Copy(this->topFunc));
        argumentsObjArgOut->InsertBefore(bailOutOnNotStackArgs);

        // Insert ByteCodeUses instr to ensure that arguments object is available on bailout
        IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Opnd* argSrc1 = argObjByteCodeArgoutCapture->GetSrc1();
        bytecodeUses->SetRemovedOpndSymbol(argSrc1->GetIsJITOptimizedReg(), argSrc1->GetStackSym()->m_id);
        callInstr->InsertBefore(bytecodeUses);
    }

    IR::Instr* byteCodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
    byteCodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(byteCodeArgOutUse);
    if (argumentsObjArgOut)
    {
        byteCodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
        byteCodeArgOutUse->SetSrc1(argumentsObjArgOut->GetSrc1());
        callInstr->InsertBefore(byteCodeArgOutUse);
    }

    // don't need the implicit "this" anymore
    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));
    startCall->GetSrc1()->AsIntConstOpnd()->IncrValue(-1); // update the count of argouts as seen by JIT, in the start call instruction

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
                                                safeThis, /*isApplyTarget*/ true, targetType, callbackDefInstr, recursiveInlineDepth, callInstr);
    return true;
}